

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaComparePreserveCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  bool bVar2;
  int tmp;
  int invert_local;
  xmlChar *y_local;
  xmlChar *x_local;
  
  _tmp = y;
  while( true ) {
    bVar2 = true;
    if ((*_tmp != 0x20) && ((*_tmp < 9 || (bVar2 = true, 10 < *_tmp)))) {
      bVar2 = *_tmp == 0xd;
    }
    y_local = x;
    if (!bVar2) break;
    _tmp = _tmp + 1;
  }
  do {
    bVar2 = false;
    if (*y_local != '\0') {
      bVar2 = *_tmp != 0;
    }
    if (!bVar2) {
      if (*y_local != '\0') {
        if (invert != 0) {
          return -1;
        }
        return 1;
      }
      if (*_tmp != 0) {
        while( true ) {
          bVar2 = true;
          if ((*_tmp != 0x20) && ((*_tmp < 9 || (bVar2 = true, 10 < *_tmp)))) {
            bVar2 = *_tmp == 0xd;
          }
          if (!bVar2) break;
          _tmp = _tmp + 1;
        }
        if (*_tmp != 0) {
          if (invert != 0) {
            return 1;
          }
          return -1;
        }
      }
      return 0;
    }
    if ((*_tmp == 0x20) || (((8 < *_tmp && (*_tmp < 0xb)) || (*_tmp == 0xd)))) {
      if (*y_local != ' ') {
        if (-1 < (int)(*y_local - 0x20)) {
          if (invert != 0) {
            return -1;
          }
          return 1;
        }
        if (invert != 0) {
          return 1;
        }
        return -1;
      }
      do {
        _tmp = _tmp + 1;
        bVar2 = true;
        if ((*_tmp != 0x20) && ((*_tmp < 9 || (bVar2 = true, 10 < *_tmp)))) {
          bVar2 = *_tmp == 0xd;
        }
      } while (bVar2);
    }
    else {
      bVar1 = *_tmp;
      if ((int)((uint)*y_local - (uint)bVar1) < 0) {
        if (invert != 0) {
          return 1;
        }
        return -1;
      }
      _tmp = _tmp + 1;
      if (0 < (int)((uint)*y_local - (uint)bVar1)) {
        if (invert == 0) {
          x_local._4_4_ = 1;
        }
        else {
          x_local._4_4_ = -1;
        }
        return x_local._4_4_;
      }
    }
    y_local = y_local + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaComparePreserveCollapseStrings(const xmlChar *x,
				        const xmlChar *y,
					int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
    }